

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

double __thiscall ON_EarthAnchorPoint::KMLOrientationTiltAngleRadians(ON_EarthAnchorPoint *this)

{
  double dVar1;
  bool bVar2;
  double tilt_radians;
  double roll_radians;
  double heading_radians;
  double local_18;
  double local_10;
  double local_8;
  
  dVar1 = ON_DBL_QNAN;
  local_8 = ON_DBL_QNAN;
  local_18 = ON_DBL_QNAN;
  local_10 = ON_DBL_QNAN;
  bVar2 = GetKMLOrientationAnglesRadians(this,&local_8,&local_18,&local_10);
  if (!bVar2) {
    local_18 = dVar1;
  }
  return local_18;
}

Assistant:

const double ON_EarthAnchorPoint::KMLOrientationTiltAngleRadians() const
{
  double heading_radians = ON_DBL_QNAN;
  double tilt_radians = ON_DBL_QNAN;
  double roll_radians = ON_DBL_QNAN;
  const bool rc = GetKMLOrientationAnglesRadians(heading_radians, tilt_radians, roll_radians);
  return rc ? tilt_radians : ON_DBL_QNAN;
}